

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O0

void __thiscall
cfd::core::Privkey::Privkey
          (Privkey *this,ByteData256 *byte_data,NetType net_type,bool is_compressed)

{
  undefined1 uVar1;
  byte bVar2;
  undefined8 uVar3;
  undefined6 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff26;
  undefined1 in_stack_ffffffffffffff27;
  CfdError error_code;
  CfdException *this_00;
  allocator local_b9;
  string local_b8 [32];
  string local_98;
  CfdSourceLocation local_78;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  byte local_1d;
  NetType local_1c;
  bool is_compressed_local;
  ByteData256 *pBStack_18;
  NetType net_type_local;
  ByteData256 *byte_data_local;
  Privkey *this_local;
  
  this_00 = (CfdException *)this;
  local_1d = is_compressed;
  local_1c = net_type;
  pBStack_18 = byte_data;
  byte_data_local = (ByteData256 *)this;
  ByteData256::GetBytes(&local_38,byte_data);
  ByteData::ByteData((ByteData *)this_00,&local_38);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_ffffffffffffff27,
                      CONCAT16(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20)));
  this->is_compressed_ = (bool)(local_1d & 1);
  this->net_type_ = local_1c;
  ByteData::GetBytes(&local_60,&this->data_);
  uVar1 = IsValid(&local_60);
  bVar2 = uVar1 ^ 0xff;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             (CONCAT17(uVar1,CONCAT16(uVar1,in_stack_ffffffffffffff20)) ^ 0xff000000000000));
  if ((bVar2 & 1) == 0) {
    return;
  }
  local_78.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_key.cpp"
               ,0x2f);
  local_78.filename = local_78.filename + 1;
  local_78.line = 0xef;
  local_78.funcname = "Privkey";
  ByteData::GetHex_abi_cxx11_(&local_98,&this->data_);
  error_code = (CfdError)((ulong)this >> 0x20);
  logger::warn<std::__cxx11::string>(&local_78,"Invalid Privkey data. hex={}.",&local_98);
  ::std::__cxx11::string::~string((string *)&local_98);
  uVar3 = __cxa_allocate_exception(0x30);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_b8,"Invalid Privkey data.",&local_b9);
  CfdException::CfdException
            (this_00,error_code,(string *)CONCAT17(uVar1,CONCAT16(bVar2,in_stack_ffffffffffffff20)))
  ;
  __cxa_throw(uVar3,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

Privkey::Privkey(
    const ByteData256 &byte_data, NetType net_type, bool is_compressed)
    : data_(ByteData(byte_data.GetBytes())),
      is_compressed_(is_compressed),
      net_type_(net_type) {
  if (!IsValid(data_.GetBytes())) {
    warn(CFD_LOG_SOURCE, "Invalid Privkey data. hex={}.", data_.GetHex());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Invalid Privkey data.");
  }
}